

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void quit_prog(void)

{
  byte bVar1;
  
  closegraph();
  textmode(0);
  bVar1 = peekb(0,0x417);
  pokeb(0,0x417,bVar1 & 0xbf);
  puts("Thankyou for using `SOFTBEEB\'\n");
  puts("Have a nice day {;-)\n");
  exit(0);
}

Assistant:

void quit_prog() {

    closegraph();
    textmode(C80);
    pokeb(0, 0x417, peekb(0, 0x417) & 0xBF);
    puts("Thankyou for using `SOFTBEEB'\n");
    puts("Have a nice day {;-)\n");
    exit(0);
}